

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_15.cpp
# Opt level: O2

int main(void)

{
  FileType local_6c;
  vector<double,_std::allocator<double>_> numbers;
  string out;
  string in;
  
  out._M_dataplus._M_p._0_4_ = 0;
  prompt_filename_abi_cxx11_(&in,(FileType *)&out);
  read_numbers(&numbers,&in);
  local_6c = out;
  prompt_filename_abi_cxx11_(&out,&local_6c);
  write_numbers(&numbers,&out);
  std::__cxx11::string::~string((string *)&out);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&numbers.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&in);
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto in = prompt_filename(FileType::in);
		auto numbers = read_numbers(in);
		auto out = prompt_filename(FileType::out);
		write_numbers(numbers, out);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << '\n';
		return -1;
	}
	catch (...)
	{
		std::cerr << "Unknown exception occured.\n";
		return -2;
	}
}